

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void udp_timer_cb(void *arg)

{
  nni_mtx *mtx;
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nni_time nVar4;
  char *pcVar5;
  nni_aio *aio;
  nng_duration ms;
  char local_e8 [8];
  char buf [128];
  uint32_t local_3c;
  udp_pipe *puStack_38;
  uint32_t cursor;
  udp_pipe *p;
  
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  nVar2 = nni_aio_result((nni_aio *)((long)arg + 0x58));
  if ((((nVar2 != NNG_ECLOSED) && (nVar2 != NNG_ESTOPPED)) && (nVar2 != NNG_ECANCELED)) &&
     (*(char *)((long)arg + 0x36) != '\x01')) {
    local_3c = 0;
    nVar4 = nni_clock();
    *(undefined8 *)((long)arg + 0xa48) = 0xffffffffffffffff;
    _Var1 = nni_id_visit((nni_id_map *)((long)arg + 0x820),(uint64_t *)0x0,&stack0xffffffffffffffc8,
                         &local_3c);
    if (_Var1) {
      buf._120_8_ = (long)arg + 0xcb8;
      do {
        if (puStack_38->expire < nVar4) {
          pcVar5 = nng_str_sockaddr(&puStack_38->peer_addr,local_e8,0x80);
          nng_log_info("NNG-UDP-INACTIVE","Pipe peer %s timed out due to inactivity",pcVar5);
          if ((*(char *)((long)arg + 1000) == '\x01') && (puStack_38->peer_id == 0)) {
            aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x9f0));
            if (aio != (nni_aio *)0x0) {
              nni_aio_list_remove(aio);
              nni_aio_finish_error(aio,NNG_ETIMEDOUT);
            }
          }
          iVar3 = nni_list_node_active(&puStack_38->node);
          if (iVar3 == 0) {
            nni_stat_inc((nni_stat_item *)buf._120_8_,1);
            udp_send_disc((udp_ep *)arg,puStack_38,DISC_INACTIVE);
          }
          else {
            nni_pipe_close(puStack_38->npipe);
          }
        }
        else {
          if ((puStack_38->dialer == true) && (puStack_38->next_creq < nVar4)) {
            udp_send_creq((udp_ep *)arg,puStack_38);
          }
          if (puStack_38->next_wake < *(ulong *)((long)arg + 0xa48)) {
            *(nng_time *)((long)arg + 0xa48) = puStack_38->next_wake;
          }
        }
        _Var1 = nni_id_visit((nni_id_map *)((long)arg + 0x820),(uint64_t *)0x0,
                             &stack0xffffffffffffffc8,&local_3c);
      } while (_Var1);
    }
    ms = -1;
    if (*(long *)((long)arg + 0xa48) != -1) {
      ms = (int)*(long *)((long)arg + 0xa48) - (int)nVar4;
    }
    nni_sleep_aio(ms,(nni_aio *)((long)arg + 0x58));
    nni_mtx_unlock(mtx);
    return;
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
udp_timer_cb(void *arg)
{
	udp_ep   *ep = arg;
	udp_pipe *p;
	int       rv;

	nni_mtx_lock(&ep->mtx);
	rv = nni_aio_result(&ep->timeaio);
	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ECANCELED:
	case NNG_ESTOPPED:
		nni_mtx_unlock(&ep->mtx);
		return;
	default:
		if (ep->closed) {
			nni_mtx_unlock(&ep->mtx);
			return;
		}
		break;
	}

	uint32_t     cursor  = 0;
	nni_time     now     = nni_clock();
	nng_duration refresh = ep->refresh;

	ep->next_wake = NNI_TIME_NEVER;
	while (nni_id_visit(&ep->pipes, NULL, (void **) &p, &cursor)) {

		if (now > p->expire) {
			char     buf[128];
			nni_aio *aio;
			nng_log_info("NNG-UDP-INACTIVE",
			    "Pipe peer %s timed out due to inactivity",
			    nng_str_sockaddr(&p->peer_addr, buf, sizeof(buf)));

			// Possibly alert the dialer, so it can restart a new
			// attempt.
			if ((ep->dialer) && (p->peer_id == 0) &&
			    (aio = nni_list_first(&ep->connaios))) {
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, NNG_ETIMEDOUT);
			}

			// If we're still on the connect list, then we need
			// take responsibility for cleaning this up.
			if (nni_list_node_active(&p->node)) {
				nni_pipe_close(p->npipe);
				continue;
			}

			// This will probably not be received by the peer,
			// since we aren't getting anything from them. But
			// having it on the wire may help debugging later.
			nni_stat_inc(&ep->st_peer_inactive, 1);
			udp_send_disc(ep, p, DISC_INACTIVE);
			continue;
		}

		if (p->dialer && now > p->next_creq) {
			udp_send_creq(ep, p);
		}
		if (p->next_wake < ep->next_wake) {
			ep->next_wake = p->next_wake;
		}
	}
	refresh = ep->next_wake == NNI_TIME_NEVER
	    ? NNG_DURATION_INFINITE
	    : (nng_duration) (ep->next_wake - now);
	nni_sleep_aio(refresh, &ep->timeaio);

	nni_mtx_unlock(&ep->mtx);
}